

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

bool check_user_password_V5(string *user_password,EncryptionData *data)

{
  int iVar1;
  bool bVar2;
  string user_data;
  string password;
  string validation_salt;
  string local_b8;
  long *local_98;
  size_t local_90;
  long local_88 [2];
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::substr((ulong)&local_98,(ulong)&data->U);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)&data->U);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)user_password);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  hash_V5(&local_38,&local_78,&local_58,&local_b8,data);
  if (local_38._M_string_length == local_90) {
    if (local_38._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_38._M_dataplus._M_p,local_98,local_38._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return bVar2;
}

Assistant:

static bool
check_user_password_V5(std::string const& user_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.11 from the PDF 1.7 extension level 3

    std::string user_data = data.getU().substr(0, 32);
    std::string validation_salt = data.getU().substr(32, 8);
    std::string password = truncate_password_V5(user_password);
    return (hash_V5(password, validation_salt, "", data) == user_data);
}